

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void DequeueConsoleText(void)

{
  int iVar1;
  TextQueue *pTVar2;
  char *pcVar3;
  TextQueue *next;
  TextQueue *queued;
  
  next = EnqueuedText;
  pTVar2 = next;
  while (next = pTVar2, next != (TextQueue *)0x0) {
    pTVar2 = next->Next;
    if ((next->bNotify & 1U) == 0) {
      iVar1 = next->PrintLevel;
      pcVar3 = FString::operator_cast_to_char_(&next->Text);
      AddToConsole(iVar1,pcVar3);
    }
    else {
      iVar1 = next->PrintLevel;
      pcVar3 = FString::operator_cast_to_char_(&next->Text);
      C_AddNotifyString(iVar1,pcVar3);
    }
    if (next != (TextQueue *)0x0) {
      TextQueue::~TextQueue(next);
      operator_delete(next,0x18);
    }
  }
  EnqueuedText = (TextQueue *)0x0;
  EnqueuedTextTail = &EnqueuedText;
  return;
}

Assistant:

void DequeueConsoleText ()
{
	TextQueue *queued = EnqueuedText;

	while (queued != NULL)
	{
		TextQueue *next = queued->Next;
		if (queued->bNotify)
		{
			C_AddNotifyString (queued->PrintLevel, queued->Text);
		}
		else
		{
			AddToConsole (queued->PrintLevel, queued->Text);
		}
		delete queued;
		queued = next;
	}
	EnqueuedText = NULL;
	EnqueuedTextTail = &EnqueuedText;
}